

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lt.c
# Opt level: O2

void lt_generate_mat(m256v *M,parameters *P,int n_ISIs,uint32_t *ISIs)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  tuple local_48;
  
  m256v_clear(M);
  uVar2 = 0;
  uVar3 = (ulong)(uint)n_ISIs;
  if (n_ISIs < 1) {
    uVar3 = uVar2;
  }
  for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    tuple_generate_from_ISI(&local_48,ISIs[uVar2],P);
    M->e[(long)local_48.b + M->rstride * uVar2] = '\x01';
    for (iVar1 = 1; iVar1 < local_48.d; iVar1 = iVar1 + 1) {
      local_48.b = (local_48.a + local_48.b) % P->W;
      M->e[(long)local_48.b + M->rstride * uVar2] = '\x01';
    }
    for (; P->P <= local_48.b1; local_48.b1 = (local_48.b1 + local_48.a1) % P->P1) {
    }
    M->e[(long)local_48.b1 + (long)P->W + M->rstride * uVar2] = '\x01';
    for (iVar1 = 1; iVar1 < local_48.d1; iVar1 = iVar1 + 1) {
      do {
        local_48.b1 = (local_48.b1 + local_48.a1) % P->P1;
      } while (P->P <= local_48.b1);
      M->e[(long)local_48.b1 + (long)P->W + M->rstride * uVar2] = '\x01';
    }
  }
  return;
}

Assistant:

void lt_generate_mat(m256v* M,
			const parameters* P,
			int n_ISIs,
			const uint32_t* ISIs)
{
	assert(M->n_row == n_ISIs);
	assert(M->n_col == P->L);

	m256v_clear(M);
	for (int i = 0; i < n_ISIs; ++i) {
		tuple T = tuple_generate_from_ISI(ISIs[i], P);
		m256v_set_el(M, i, T.b, 1);
		for (int j = 1; j < T.d; ++j) {
			T.b = (T.b + T.a) % P->W;
			m256v_set_el(M, i, T.b, 1);
		}
		while (T.b1 >= P->P)
			T.b1 = (T.b1 + T.a1) % P->P1;
		m256v_set_el(M, i, P->W + T.b1, 1);
		for (int j = 1; j < T.d1; ++j) {
			T.b1 = (T.b1 + T.a1) % P->P1;
			while (T.b1 >= P->P)
				T.b1 = (T.b1 + T.a1) % P->P1;
			m256v_set_el(M, i, P->W + T.b1, 1);
		}
	}
}